

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuiRenderer.cpp
# Opt level: O3

void __thiscall
myvk::ImGuiRenderer::setup_render_state
          (ImGuiRenderer *this,Ptr<CommandBuffer> *command_buffer,int fb_width,int fb_height,
          uint32_t current_frame)

{
  CommandBuffer *pCVar1;
  pointer psVar2;
  ImDrawData *pIVar3;
  undefined1 auVar4 [16];
  initializer_list<std::shared_ptr<myvk::DescriptorSet>_> __l;
  initializer_list<VkViewport> __l_00;
  vector<VkViewport,_std::allocator<VkViewport>_> local_88;
  allocator_type local_6d;
  int local_6c;
  shared_ptr<myvk::DescriptorSet> local_68;
  Ptr<PipelineBase> local_58;
  undefined1 local_48 [8];
  pointer puStack_40;
  pointer local_38;
  
  local_6c = fb_width;
  pIVar3 = ImGui::GetDrawData();
  pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_88.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(this->m_pipeline).
                super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_88.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)(this->m_pipeline).
                super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  if (local_88.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_88.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
       super__Vector_impl_data._M_finish)->width =
           (float)((int)(local_88.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>.
                         _M_impl.super__Vector_impl_data._M_finish)->width + 1);
      UNLOCK();
    }
    else {
      (local_88.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
       super__Vector_impl_data._M_finish)->width =
           (float)((int)(local_88.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>.
                         _M_impl.super__Vector_impl_data._M_finish)->width + 1);
    }
  }
  CommandBuffer::CmdBindPipeline(pCVar1,(Ptr<PipelineBase> *)&local_88);
  if (local_88.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_88.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_68.super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this->m_descriptor_set).super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_68.super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->m_descriptor_set).super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_68.super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_68.super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_68.super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_68.super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi)->_M_use_count =
           (local_68.super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  __l._M_len = 1;
  __l._M_array = &local_68;
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::vector((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
            *)&local_88,__l,&local_6d);
  local_58.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &((this->m_pipeline).super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->super_PipelineBase;
  local_58.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (this->m_pipeline).super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_58.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_58.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      )->_M_use_count =
           (local_58.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_use_count + 1;
    }
  }
  local_48 = (undefined1  [8])0x0;
  puStack_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  CommandBuffer::CmdBindDescriptorSets
            (pCVar1,(vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
                     *)&local_88,&local_58,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  if (local_48 != (undefined1  [8])0x0) {
    operator_delete((void *)local_48,(long)local_38 - (long)local_48);
  }
  if (local_58.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<myvk::PipelineBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::~vector((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
             *)&local_88);
  if (local_68.super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_68.super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  psVar2 = (this->m_vertex_buffers).
           super__Vector_base<std::shared_ptr<myvk::Buffer>,_std::allocator<std::shared_ptr<myvk::Buffer>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_88.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)psVar2[current_frame].super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
  local_88.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)psVar2[current_frame].super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if (local_88.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_88.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
       super__Vector_impl_data._M_finish)->width =
           (float)((int)(local_88.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>.
                         _M_impl.super__Vector_impl_data._M_finish)->width + 1);
      UNLOCK();
    }
    else {
      (local_88.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
       super__Vector_impl_data._M_finish)->width =
           (float)((int)(local_88.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>.
                         _M_impl.super__Vector_impl_data._M_finish)->width + 1);
    }
  }
  CommandBuffer::CmdBindVertexBuffer(pCVar1,(Ptr<BufferBase> *)&local_88,0,0);
  if (local_88.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_88.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  psVar2 = (this->m_index_buffers).
           super__Vector_base<std::shared_ptr<myvk::Buffer>,_std::allocator<std::shared_ptr<myvk::Buffer>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_88.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)psVar2[current_frame].super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
  local_88.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)psVar2[current_frame].super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi;
  if (local_88.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_88.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
       super__Vector_impl_data._M_finish)->width =
           (float)((int)(local_88.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>.
                         _M_impl.super__Vector_impl_data._M_finish)->width + 1);
      UNLOCK();
    }
    else {
      (local_88.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
       super__Vector_impl_data._M_finish)->width =
           (float)((int)(local_88.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>.
                         _M_impl.super__Vector_impl_data._M_finish)->width + 1);
    }
  }
  CommandBuffer::CmdBindIndexBuffer(pCVar1,(Ptr<BufferBase> *)&local_88,0,VK_INDEX_TYPE_UINT16);
  if (local_88.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
      super__Vector_impl_data._M_finish != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_88.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
               super__Vector_impl_data._M_finish);
  }
  puStack_40 = (pointer)CONCAT44((float)fb_height,(float)local_6c);
  pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  local_48 = (undefined1  [8])0x0;
  local_38 = (pointer)0x3f80000000000000;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_48;
  std::vector<VkViewport,_std::allocator<VkViewport>_>::vector
            (&local_88,__l_00,(allocator_type *)&local_68);
  CommandBuffer::CmdSetViewport(pCVar1,&local_88);
  if ((element_type *)
      local_88.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
      super__Vector_impl_data._M_start != (element_type *)0x0) {
    operator_delete(local_88.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_88.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_88.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  auVar4._8_8_ = 0;
  auVar4._0_4_ = (pIVar3->DisplaySize).x;
  auVar4._4_4_ = (pIVar3->DisplaySize).y;
  auVar4 = divps(_DAT_002a21d0,auVar4);
  local_88.super__Vector_base<VkViewport,_std::allocator<VkViewport>_>._M_impl.
  super__Vector_impl_data._M_start = auVar4._0_8_;
  local_48 = (undefined1  [8])
             CONCAT44(-1.0 - (pIVar3->DisplayPos).y * auVar4._4_4_,
                      -1.0 - (pIVar3->DisplayPos).x * auVar4._0_4_);
  CommandBuffer::CmdPushConstants
            ((command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr,&this->m_pipeline_layout,1,0,8,&local_88);
  CommandBuffer::CmdPushConstants
            ((command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr,&this->m_pipeline_layout,1,8,8,local_48);
  return;
}

Assistant:

void ImGuiRenderer::setup_render_state(const Ptr<CommandBuffer> &command_buffer, int fb_width, int fb_height,
                                       uint32_t current_frame) const {
	ImDrawData *draw_data = ImGui::GetDrawData();

	{
		command_buffer->CmdBindPipeline(m_pipeline);
		command_buffer->CmdBindDescriptorSets({m_descriptor_set}, m_pipeline, {});
		command_buffer->CmdBindVertexBuffer(m_vertex_buffers[current_frame], 0);
		command_buffer->CmdBindIndexBuffer(m_index_buffers[current_frame], 0,
		                                   sizeof(ImDrawIdx) == 2 ? VK_INDEX_TYPE_UINT16 : VK_INDEX_TYPE_UINT32);
	}

	// Setup viewport:
	{
		VkViewport viewport;
		viewport.x = 0;
		viewport.y = 0;
		viewport.width = (float)fb_width;
		viewport.height = (float)fb_height;
		viewport.minDepth = 0.0f;
		viewport.maxDepth = 1.0f;
		command_buffer->CmdSetViewport({viewport});
	}

	// Setup scale and translation:
	// Our visible imgui space lies from draw_data->DisplayPps (top left) to
	// draw_data->DisplayPos+data_data->DisplaySize (bottom right). DisplayPos is (0,0) for single viewport apps.
	{
		float scale[] = {2.0f / draw_data->DisplaySize.x, 2.0f / draw_data->DisplaySize.y};
		float translate[] = {-1.0f - draw_data->DisplayPos.x * scale[0], -1.0f - draw_data->DisplayPos.y * scale[1]};
		command_buffer->CmdPushConstants(m_pipeline_layout, VK_SHADER_STAGE_VERTEX_BIT, sizeof(float) * 0,
		                                 sizeof(scale), scale);
		command_buffer->CmdPushConstants(m_pipeline_layout, VK_SHADER_STAGE_VERTEX_BIT, sizeof(float) * 2,
		                                 sizeof(translate), translate);
	}
}